

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.hpp
# Opt level: O0

var * __thiscall
cs::domain_manager::get_var_current<cs::var_id_const&>(domain_manager *this,var_id *name)

{
  domain_type *in_RDI;
  stack_type<cs::domain_type,_std::allocator> *in_stack_00000020;
  var_id *in_stack_ffffffffffffffd8;
  var *local_8;
  
  if (*(long *)(in_RDI->m_reflect).
               super_raw_hash_map<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               .ctrl_ == 0) {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000020);
    local_8 = domain_type::get_var(in_RDI,in_stack_ffffffffffffffd8);
  }
  else {
    stack_type<cs::domain_type,_std::allocator>::top(in_stack_00000020);
    local_8 = domain_type::get_var(in_RDI,in_stack_ffffffffffffffd8);
  }
  return local_8;
}

Assistant:

var &get_var_current(T &&name)
		{
			if (fiber_stack != nullptr)
				return fiber_stack->top().get_var(name);
			else
				return m_data.top().get_var(name);
		}